

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version.cpp
# Opt level: O0

void __thiscall setup::version::load(version *this,istream *is)

{
  bool bVar1;
  int iVar2;
  type tVar3;
  void *pvVar4;
  type tVar5;
  undefined8 *puVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  char *in_RSI;
  uint *in_RDI;
  bad_lexical_cast *anon_var_0_1;
  size_t d_end;
  uint d;
  size_t d_start;
  uint c_1;
  size_t c_end;
  size_t c_start;
  uint b_1;
  size_t b_end;
  size_t b_start;
  uint a_1;
  size_t a_end;
  size_t a_start;
  size_t bracket;
  string version_str;
  char *end;
  size_t i_1;
  stored_version version_string;
  bad_lexical_cast *anon_var_0;
  uint c;
  uint b;
  uint a;
  string version_str_1;
  size_t i;
  stored_legacy_version legacy_version;
  char (*in_stack_fffffffffffffda8) [11];
  undefined4 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb4;
  undefined1 in_stack_fffffffffffffdb5;
  undefined1 in_stack_fffffffffffffdb6;
  undefined1 in_stack_fffffffffffffdb7;
  allocator<char> *in_stack_fffffffffffffdb8;
  enum_type flag;
  flags<setup::version::flags_Enum_,_3UL> *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  undefined8 local_188;
  uint local_174;
  long local_170;
  uint local_164;
  long local_160;
  uint local_154;
  long local_150;
  long local_148;
  uint local_13c;
  long local_138;
  long local_130;
  uint local_124;
  long local_120;
  long local_118;
  long local_110;
  allocator<char> local_101;
  string local_100 [39];
  undefined1 local_d9;
  char *local_d8;
  ulong local_d0;
  undefined1 local_c8 [8];
  undefined4 local_c0;
  undefined1 auStack_bc [68];
  uint local_78;
  uint local_74;
  uint local_70;
  allocator local_59;
  string local_58 [32];
  undefined8 local_38;
  undefined8 local_30;
  ulong local_28;
  char local_1c [2];
  char cStack_1a;
  char cStack_18;
  char cStack_15;
  undefined4 local_14;
  char *local_10;
  
  local_10 = in_RSI;
  std::istream::read(in_RSI,(long)local_1c);
  if ((local_1c[0] == 'i') && (local_14._3_1_ == '\x1a')) {
    for (local_28 = 0; uVar9 = local_28,
        tVar3 = boost::size<setup::(anonymous_namespace)::known_legacy_version[2]>
                          ((known_legacy_version (*) [2])0x18ac7b), uVar9 < tVar3;
        local_28 = local_28 + 1) {
      iVar2 = memcmp(local_1c,(anonymous_namespace)::legacy_versions + local_28 * 0x20,0xc);
      if (iVar2 == 0) {
        *in_RDI = *(uint *)((anonymous_namespace)::legacy_versions + local_28 * 0x20 + 0x10);
        *(undefined8 *)(in_RDI + 2) =
             *(undefined8 *)((anonymous_namespace)::legacy_versions + local_28 * 0x20 + 0x18);
        *(undefined1 *)(in_RDI + 4) = 1;
        return;
      }
    }
    if (((local_1c[0] != 'i') || (cStack_1a != '.')) ||
       ((cStack_18 != '.' || ((cStack_15 != '-' || ((char)local_14 != '-')))))) {
      pvVar4 = (void *)__cxa_allocate_exception(8);
      memset(pvVar4,0,8);
      version_error::version_error
                ((version_error *)
                 CONCAT17(in_stack_fffffffffffffdb7,
                          CONCAT16(in_stack_fffffffffffffdb6,
                                   CONCAT15(in_stack_fffffffffffffdb5,
                                            CONCAT14(in_stack_fffffffffffffdb4,
                                                     in_stack_fffffffffffffdb0)))));
      __cxa_throw(pvVar4,&version_error::typeinfo,version_error::~version_error);
    }
    if ((local_14._1_1_ == '1') && (local_14._2_1_ == '6')) {
      flags<setup::version::flags_Enum_,_3UL>::flags
                (in_stack_fffffffffffffdc0,(enum_type)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
      *(undefined8 *)(in_RDI + 2) = local_30;
    }
    else {
      if ((local_14._1_1_ != '3') || (local_14._2_1_ != '2')) {
        pvVar4 = (void *)__cxa_allocate_exception(8);
        memset(pvVar4,0,8);
        version_error::version_error
                  ((version_error *)
                   CONCAT17(in_stack_fffffffffffffdb7,
                            CONCAT16(in_stack_fffffffffffffdb6,
                                     CONCAT15(in_stack_fffffffffffffdb5,
                                              CONCAT14(in_stack_fffffffffffffdb4,
                                                       in_stack_fffffffffffffdb0)))));
        __cxa_throw(pvVar4,&version_error::typeinfo,version_error::~version_error);
      }
      flags<setup::info::entry_types_Enum_,_21UL>::flags
                ((flags<setup::info::entry_types_Enum_,_21UL> *)
                 CONCAT17(in_stack_fffffffffffffdb7,
                          CONCAT16(in_stack_fffffffffffffdb6,
                                   CONCAT15(in_stack_fffffffffffffdb5,
                                            CONCAT14(in_stack_fffffffffffffdb4,
                                                     in_stack_fffffffffffffdb0)))),
                 (Zero)in_stack_fffffffffffffda8);
      *(undefined8 *)(in_RDI + 2) = local_38;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,local_1c,0xc,&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    std::__cxx11::string::data();
    local_70 = util::to_unsigned((char *)CONCAT17(in_stack_fffffffffffffdb7,
                                                  CONCAT16(in_stack_fffffffffffffdb6,
                                                           CONCAT15(in_stack_fffffffffffffdb5,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffdb4,
                                                  in_stack_fffffffffffffdb0)))),
                                 (size_t)in_stack_fffffffffffffda8);
    std::__cxx11::string::data();
    local_74 = util::to_unsigned((char *)CONCAT17(in_stack_fffffffffffffdb7,
                                                  CONCAT16(in_stack_fffffffffffffdb6,
                                                           CONCAT15(in_stack_fffffffffffffdb5,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffdb4,
                                                  in_stack_fffffffffffffdb0)))),
                                 (size_t)in_stack_fffffffffffffda8);
    std::__cxx11::string::data();
    local_78 = util::to_unsigned((char *)CONCAT17(in_stack_fffffffffffffdb7,
                                                  CONCAT16(in_stack_fffffffffffffdb6,
                                                           CONCAT15(in_stack_fffffffffffffdb5,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffdb4,
                                                  in_stack_fffffffffffffdb0)))),
                                 (size_t)in_stack_fffffffffffffda8);
    *in_RDI = local_70 << 0x18 | local_74 << 0x10 | local_78 << 8;
    *(undefined1 *)(in_RDI + 4) = 0;
    std::__cxx11::string::~string(local_58);
  }
  else {
    local_c0 = local_14;
    std::istream::read(local_10,(long)auStack_bc);
    for (local_d0 = 0; uVar9 = local_d0,
        tVar5 = boost::size<setup::(anonymous_namespace)::known_version[114]>
                          ((known_version (*) [114])0x18b0e6), uVar9 < tVar5;
        local_d0 = local_d0 + 1) {
      if (((anonymous_namespace)::versions[local_d0 * 0x50] != '\0') &&
         (iVar2 = memcmp(local_c8,(anonymous_namespace)::versions + local_d0 * 0x50,0x40),
         iVar2 == 0)) {
        *in_RDI = *(uint *)((anonymous_namespace)::versions + local_d0 * 0x50 + 0x40);
        *(undefined8 *)(in_RDI + 2) =
             *(undefined8 *)((anonymous_namespace)::versions + local_d0 * 0x50 + 0x48);
        *(undefined1 *)(in_RDI + 4) = 1;
        return;
      }
    }
    boost::size<char[64]>((char (*) [64])0x18b1b0);
    local_d9 = 0;
    local_d8 = std::find<char*,char>
                         ((char *)in_stack_fffffffffffffdd0,
                          (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                          (char *)in_stack_fffffffffffffdc0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char*,void>
              (in_stack_fffffffffffffdd0,
               (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
               (char *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    std::allocator<char>::~allocator(&local_101);
    bVar1 = boost::algorithm::contains<std::__cxx11::string,char[9]>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffdb7,
                                CONCAT16(in_stack_fffffffffffffdb6,
                                         CONCAT15(in_stack_fffffffffffffdb5,
                                                  CONCAT14(in_stack_fffffffffffffdb4,
                                                           in_stack_fffffffffffffdb0)))),
                       in_stack_fffffffffffffda8);
    if (!bVar1) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = 0;
      version_error::version_error
                ((version_error *)
                 CONCAT17(in_stack_fffffffffffffdb7,
                          CONCAT16(in_stack_fffffffffffffdb6,
                                   CONCAT15(in_stack_fffffffffffffdb5,
                                            CONCAT14(in_stack_fffffffffffffdb4,
                                                     in_stack_fffffffffffffdb0)))));
      __cxa_throw(puVar6,&version_error::typeinfo,version_error::~version_error);
    }
    *in_RDI = 0;
    local_110 = std::__cxx11::string::find('\0',0x28);
    while (flag = (enum_type)((ulong)in_stack_fffffffffffffdb8 >> 0x20), local_110 != -1) {
      lVar7 = std::__cxx11::string::length();
      if (5 < (ulong)(lVar7 - local_110)) {
        local_118 = local_110 + 1;
        local_120 = std::__cxx11::string::find_first_not_of((char *)local_100,0x1cc1f0);
        if ((local_120 != -1) &&
           (pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_100), *pcVar8 == '.')) {
          std::__cxx11::string::data();
          local_124 = util::to_unsigned((char *)CONCAT17(in_stack_fffffffffffffdb7,
                                                         CONCAT16(in_stack_fffffffffffffdb6,
                                                                  CONCAT15(in_stack_fffffffffffffdb5
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffffdb4,
                                                  in_stack_fffffffffffffdb0)))),
                                        (size_t)in_stack_fffffffffffffda8);
          local_130 = local_120 + 1;
          local_138 = std::__cxx11::string::find_first_not_of((char *)local_100,0x1cc1f0);
          if ((local_138 != -1) &&
             (pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_100), *pcVar8 == '.'))
          {
            std::__cxx11::string::data();
            local_13c = util::to_unsigned((char *)CONCAT17(in_stack_fffffffffffffdb7,
                                                           CONCAT16(in_stack_fffffffffffffdb6,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffffdb5,
                                                  CONCAT14(in_stack_fffffffffffffdb4,
                                                           in_stack_fffffffffffffdb0)))),
                                          (size_t)in_stack_fffffffffffffda8);
            local_148 = local_138 + 1;
            local_150 = std::__cxx11::string::find_first_not_of((char *)local_100,0x1cc1f0);
            if (local_150 != -1) {
              std::__cxx11::string::data();
              local_154 = util::to_unsigned((char *)CONCAT17(in_stack_fffffffffffffdb7,
                                                             CONCAT16(in_stack_fffffffffffffdb6,
                                                                      CONCAT15(
                                                  in_stack_fffffffffffffdb5,
                                                  CONCAT14(in_stack_fffffffffffffdb4,
                                                           in_stack_fffffffffffffdb0)))),
                                            (size_t)in_stack_fffffffffffffda8);
              local_160 = local_150;
              pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_100);
              if (*pcVar8 == 'a') {
                uVar9 = local_160 + 1;
                uVar10 = std::__cxx11::string::length();
                if (uVar10 <= uVar9) goto LAB_0018b6f5;
                local_160 = local_160 + 1;
              }
              local_164 = 0;
              pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_100);
              if (*pcVar8 == '.') {
                local_160 = local_160 + 1;
                local_170 = std::__cxx11::string::find_first_not_of((char *)local_100,0x1cc1f0);
                if ((local_170 != -1) && (local_170 != local_160)) {
                  std::__cxx11::string::data();
                  local_164 = util::to_unsigned((char *)CONCAT17(in_stack_fffffffffffffdb7,
                                                                 CONCAT16(in_stack_fffffffffffffdb6,
                                                                          CONCAT15(
                                                  in_stack_fffffffffffffdb5,
                                                  CONCAT14(in_stack_fffffffffffffdb4,
                                                           in_stack_fffffffffffffdb0)))),
                                                (size_t)in_stack_fffffffffffffda8);
                }
              }
              local_174 = local_124 << 0x18 | local_13c << 0x10 | local_154 << 8 | local_164;
              in_stack_fffffffffffffdc0 =
                   (flags<setup::version::flags_Enum_,_3UL> *)
                   std::max<unsigned_int>(in_RDI,&local_174);
              *in_RDI = (uint)(in_stack_fffffffffffffdc0->_flags).super__Base_bitset<1UL>._M_w;
            }
          }
        }
      }
LAB_0018b6f5:
      local_110 = std::__cxx11::string::find('\0',0x28);
    }
    if (*in_RDI == 0) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = 0;
      version_error::version_error
                ((version_error *)
                 CONCAT17(in_stack_fffffffffffffdb7,
                          CONCAT16(in_stack_fffffffffffffdb6,
                                   CONCAT15(in_stack_fffffffffffffdb5,
                                            CONCAT14(in_stack_fffffffffffffdb4,
                                                     in_stack_fffffffffffffdb0)))));
      __cxa_throw(puVar6,&version_error::typeinfo,version_error::~version_error);
    }
    flags<setup::info::entry_types_Enum_,_21UL>::flags
              ((flags<setup::info::entry_types_Enum_,_21UL> *)
               CONCAT17(in_stack_fffffffffffffdb7,
                        CONCAT16(in_stack_fffffffffffffdb6,
                                 CONCAT15(in_stack_fffffffffffffdb5,
                                          CONCAT14(in_stack_fffffffffffffdb4,
                                                   in_stack_fffffffffffffdb0)))),
               (Zero)in_stack_fffffffffffffda8);
    *(undefined8 *)(in_RDI + 2) = local_188;
    if (((0x602ffff < *in_RDI) ||
        (in_stack_fffffffffffffdb7 =
              boost::algorithm::contains<std::__cxx11::string,char[9]>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffdb7,
                                  CONCAT16(in_stack_fffffffffffffdb6,
                                           CONCAT15(in_stack_fffffffffffffdb5,
                                                    CONCAT14(in_stack_fffffffffffffdb4,
                                                             in_stack_fffffffffffffdb0)))),
                         in_stack_fffffffffffffda8), (bool)in_stack_fffffffffffffdb7)) ||
       (in_stack_fffffffffffffdb6 =
             boost::algorithm::contains<std::__cxx11::string,char[9]>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(in_stack_fffffffffffffdb7,
                                 CONCAT16(in_stack_fffffffffffffdb6,
                                          CONCAT15(in_stack_fffffffffffffdb5,
                                                   CONCAT14(in_stack_fffffffffffffdb4,
                                                            in_stack_fffffffffffffdb0)))),
                        in_stack_fffffffffffffda8), (bool)in_stack_fffffffffffffdb6)) {
      flags<setup::version::flags_Enum_,_3UL>::operator|=(in_stack_fffffffffffffdc0,flag);
    }
    bVar1 = boost::algorithm::contains<std::__cxx11::string,char[9]>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffdb7,
                                CONCAT16(in_stack_fffffffffffffdb6,
                                         CONCAT15(in_stack_fffffffffffffdb5,
                                                  CONCAT14(in_stack_fffffffffffffdb4,
                                                           in_stack_fffffffffffffdb0)))),
                       in_stack_fffffffffffffda8);
    if ((bVar1) ||
       (bVar1 = boost::algorithm::contains<std::__cxx11::string,char[9]>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffdb7,
                                    CONCAT16(in_stack_fffffffffffffdb6,
                                             CONCAT15(bVar1,CONCAT14(in_stack_fffffffffffffdb4,
                                                                     in_stack_fffffffffffffdb0)))),
                           in_stack_fffffffffffffda8), bVar1)) {
      flags<setup::version::flags_Enum_,_3UL>::operator|=(in_stack_fffffffffffffdc0,flag);
    }
    *(undefined1 *)(in_RDI + 4) = 0;
    std::__cxx11::string::~string(local_100);
  }
  return;
}

Assistant:

void version::load(std::istream & is) {
	
	static const char digits[] = "0123456789";
	
	BOOST_STATIC_ASSERT(sizeof(stored_legacy_version) <= sizeof(stored_version));
	
	stored_legacy_version legacy_version;
	is.read(legacy_version, std::streamsize(sizeof(legacy_version)));
	
	if(legacy_version[0] == 'i' && legacy_version[sizeof(legacy_version) - 1] == '\x1a') {
		
		for(size_t i = 0; i < size_t(boost::size(legacy_versions)); i++) {
			if(!memcmp(legacy_version, legacy_versions[i].name, sizeof(legacy_version))) {
				value = legacy_versions[i].version;
				variant = legacy_versions[i].variant;
				known = true;
				debug("known legacy version: \"" << versions[i].name << '"');
				return;
			}
		}
		
		debug("unknown legacy version: \""
		      << std::string(legacy_version, sizeof(legacy_version)) << '"');
		
		if(legacy_version[0] != 'i' || legacy_version[2] != '.' || legacy_version[4] != '.'
		   || legacy_version[7] != '-' || legacy_version[8] != '-') {
			throw version_error();
		}
		
		if(legacy_version[9] == '1' && legacy_version[10] == '6') {
			variant = Bits16;
		} else if(legacy_version[9] == '3' && legacy_version[10] == '2') {
			variant = 0;
		} else {
			throw version_error();
		}
		
		std::string version_str(legacy_version, sizeof(legacy_version));
		
		try {
			unsigned a = util::to_unsigned(version_str.data() + 1, 1);
			unsigned b = util::to_unsigned(version_str.data() + 3, 1);
			unsigned c = util::to_unsigned(version_str.data() + 5, 2);
			value = INNO_VERSION(a, b, c);
		} catch(const boost::bad_lexical_cast &) {
			throw version_error();
		}
		
		known = false;
		
		return;
	}
	
	stored_version version_string;
	BOOST_STATIC_ASSERT(sizeof(legacy_version) <= sizeof(version_string));
	memcpy(version_string, legacy_version, sizeof(legacy_version));
	is.read(version_string + sizeof(legacy_version),
	        std::streamsize(sizeof(version_string) - sizeof(legacy_version)));
	
	
	for(size_t i = 0; i < size_t(boost::size(versions)); i++) {
		if(versions[i].name[0] != '\0' && !memcmp(version_string, versions[i].name, sizeof(version_string))) {
			value = versions[i].version;
			variant = versions[i].variant;
			known = true;
			debug("known version: \"" << versions[i].name << '"');
			return;
		}
	}
	
	char * end = std::find(version_string, version_string + boost::size(version_string), '\0');
	std::string version_str(version_string, end);
	debug("unknown version: \"" << version_str << '"');
	if(!boost::contains(version_str, "Inno Setup")) {
		throw version_error();
	}
	
	value = 0;
	size_t bracket = version_str.find('(');
	for(; bracket != std::string::npos; bracket = version_str.find('(', bracket + 1)) {
		
		if(version_str.length() - bracket < 6) {
			continue;
		}
		
		try {
			
			size_t a_start = bracket + 1;
			size_t a_end = version_str.find_first_not_of(digits, a_start);
			if(a_end == std::string::npos || version_str[a_end] != '.') {
				continue;
			}
			unsigned a = util::to_unsigned(version_str.data() + a_start, a_end - a_start);
			
			size_t b_start = a_end + 1;
			size_t b_end = version_str.find_first_not_of(digits, b_start);
			if(b_end == std::string::npos || version_str[b_end] != '.') {
				continue;
			}
			unsigned b = util::to_unsigned(version_str.data() + b_start, b_end - b_start);
			
			size_t c_start = b_end + 1;
			size_t c_end = version_str.find_first_not_of(digits, c_start);
			if(c_end == std::string::npos) {
				continue;
			}
			unsigned c = util::to_unsigned(version_str.data() + c_start, c_end - c_start);
			
			size_t d_start = c_end;
			if(version_str[d_start] == 'a') {
				if(d_start + 1 >= version_str.length()) {
					continue;
				}
				d_start++;
			}
			
			unsigned d = 0;
			if(version_str[d_start] == '.') {
				d_start++;
				size_t d_end = version_str.find_first_not_of(digits, d_start);
				if(d_end != std::string::npos && d_end != d_start) {
					d = util::to_unsigned(version_str.data() + d_start, d_end - d_start);
				}
			}
			
			value = std::max(value, INNO_VERSION_EXT(a, b, c, d));
			
		} catch(const boost::bad_lexical_cast &) {
			continue;
		}
	}
	if(!value) {
		throw version_error();
	}
	
	variant = 0;
	if(value >= INNO_VERSION(6, 3, 0) ||
	   boost::contains(version_str, "(u)") || boost::contains(version_str, "(U)")) {
		variant |= Unicode;
	}
	if(boost::contains(version_str, "My Inno Setup Extensions") || boost::contains(version_str, "with ISX")) {
		variant |= ISX;
	}
	
	known = false;
}